

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int handle_certificate(ptls_t *tls,uint8_t *src,uint8_t *end,int *got_certs)

{
  st_ptls_on_extension_t *psVar1;
  st_ptls_verify_certificate_t *psVar2;
  ushort extid;
  ushort uVar3;
  int iVar4;
  long lVar5;
  char **ppcVar6;
  char *pcVar7;
  ulong uVar8;
  ushort *puVar9;
  int iVar10;
  ulong uVar11;
  ushort *puVar12;
  uint8_t *puVar13;
  ushort *puVar14;
  ptls_iovec_t pVar15;
  st_ptls_extension_bitmap_t bitmap;
  ptls_iovec_t certs [16];
  
  iVar10 = 0x32;
  iVar4 = iVar10;
  if (src != end) {
    if ((((uint8_t *)(ulong)*src <= end + ~(ulong)src) && (iVar4 = 0x2f, *src == 0)) &&
       (iVar4 = iVar10, (uint8_t *)0x2 < end + ~(ulong)src)) {
      lVar5 = 1;
      uVar8 = 0;
      do {
        uVar8 = (ulong)src[lVar5] | uVar8 << 8;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 4);
      puVar12 = (ushort *)(src + 4);
      if (uVar8 <= (ulong)((long)end - (long)puVar12)) {
        puVar9 = (ushort *)(uVar8 + (long)puVar12);
        uVar8 = 0;
        while (puVar12 != puVar9) {
          if ((ulong)((long)puVar9 - (long)puVar12) < 3) {
            return 0x32;
          }
          lVar5 = 0;
          uVar11 = 0;
          do {
            uVar11 = (ulong)*(byte *)((long)puVar12 + lVar5) | uVar11 << 8;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 3);
          puVar13 = (uint8_t *)((long)puVar12 + 3);
          if ((ulong)((long)puVar9 - (long)puVar13) < uVar11) {
            return 0x32;
          }
          if (uVar8 < 0x10) {
            certs[uVar8].base = puVar13;
            certs[uVar8].len = uVar11;
            uVar8 = uVar8 + 1;
          }
          bitmap.bits = 0;
          puVar12 = (ushort *)(puVar13 + uVar11);
          if ((ulong)((long)puVar9 - (long)puVar12) < 2) {
            return 0x32;
          }
          puVar14 = puVar12 + 1;
          uVar11 = (ulong)(ushort)(*puVar12 << 8 | *puVar12 >> 8);
          if ((ulong)((long)puVar9 - (long)puVar14) < uVar11) {
            return 0x32;
          }
          puVar12 = (ushort *)(uVar11 + (long)puVar14);
          while (puVar14 != puVar12) {
            if ((long)puVar12 - (long)puVar14 < 2) {
              return 0x32;
            }
            extid = *puVar14 << 8 | *puVar14 >> 8;
            iVar4 = extension_bitmap_testandset(&bitmap,0xb,extid);
            if (iVar4 == 0) {
              return 0x2f;
            }
            if (((long)puVar12 - (long)puVar14) - 2U < 2) {
              return 0x32;
            }
            uVar3 = puVar14[1] << 8 | puVar14[1] >> 8;
            pVar15.base = puVar14 + 2;
            if ((ulong)((long)puVar12 - (long)pVar15.base) < (ulong)uVar3) {
              return 0x32;
            }
            puVar14 = (ushort *)((long)pVar15.base + (ulong)uVar3);
            psVar1 = tls->ctx->on_extension;
            if ((psVar1 != (st_ptls_on_extension_t *)0x0) &&
               (pVar15.len._0_2_ = uVar3, pVar15.len._2_6_ = 0,
               iVar4 = (*psVar1->cb)(psVar1,tls,'\v',extid,pVar15), iVar4 != 0)) {
              return 1;
            }
          }
        }
        iVar4 = 0x32;
        if (puVar9 == (ushort *)end) {
          psVar2 = tls->ctx->verify_certificate;
          if (psVar2 != (st_ptls_verify_certificate_t *)0x0) {
            if ((tls->field_0x1e8 & 1) == 0) {
              ppcVar6 = &tls->server_name;
              if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x5) ==
                  (undefined1  [112])0x1) {
                ppcVar6 = &(tls->ech).client.public_name;
              }
              pcVar7 = *ppcVar6;
            }
            else {
              pcVar7 = (char *)0x0;
            }
            iVar4 = (*psVar2->cb)(psVar2,tls,pcVar7,&(tls->certificate_verify).cb,
                                  &(tls->certificate_verify).verify_ctx,certs,uVar8);
            if (iVar4 != 0) {
              return iVar4;
            }
          }
          *got_certs = (uint)(uVar8 != 0);
          iVar4 = 0;
        }
      }
    }
  }
  return iVar4;
}

Assistant:

static int handle_certificate(ptls_t *tls, const uint8_t *src, const uint8_t *end, int *got_certs)
{
    ptls_iovec_t certs[16];
    size_t num_certs = 0;
    int ret = 0;

    /* certificate request context */
    ptls_decode_open_block(src, end, 1, {
        if (src != end) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    });
    /* certificate_list */
    ptls_decode_block(src, end, 3, {
        while (src != end) {
            ptls_decode_open_block(src, end, 3, {
                if (num_certs < PTLS_ELEMENTSOF(certs))
                    certs[num_certs++] = ptls_iovec_init(src, end - src);
                src = end;
            });
            uint16_t type;
            decode_open_extensions(src, end, PTLS_HANDSHAKE_TYPE_CERTIFICATE, &type, {
                if (tls->ctx->on_extension != NULL &&
                    (ret = tls->ctx->on_extension->cb(tls->ctx->on_extension, tls, PTLS_HANDSHAKE_TYPE_CERTIFICATE, type,
                                                      ptls_iovec_init(src, end - src)) != 0))
                    goto Exit;
                src = end;
            });
        }
    });

    if (tls->ctx->verify_certificate != NULL) {
        const char *server_name = NULL;
        if (!ptls_is_server(tls)) {
            if (tls->ech.offered && !ptls_is_ech_handshake(tls, NULL, NULL, NULL)) {
                server_name = tls->ech.client.public_name;
            } else {
                server_name = tls->server_name;
            }
        }
        if ((ret = tls->ctx->verify_certificate->cb(tls->ctx->verify_certificate, tls, server_name, &tls->certificate_verify.cb,
                                                    &tls->certificate_verify.verify_ctx, certs, num_certs)) != 0)
            goto Exit;
    }

    *got_certs = num_certs != 0;

Exit:
    return ret;
}